

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  deUint32 format;
  deUint32 type;
  byte bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int width;
  int height;
  int xoffset;
  int yoffset;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  Context *pCVar7;
  NotSupportedError *this_01;
  int iVar8;
  ChannelOrder CVar9;
  bool bVar10;
  int ndx;
  long lVar11;
  deUint32 tex;
  Random rnd;
  Vec4 colorA;
  TextureLevel data;
  TextureFormat fmt;
  Vec4 colorB;
  PixelBufferAccess local_1c0;
  Vector<float,_4> local_198;
  GradientShader shader;
  
  iVar2 = (*((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar11 = CONCAT44(extraout_var,iVar2);
  bVar10 = false;
  if ((0 < *(int *)(lVar11 + 8)) && (0 < *(int *)(lVar11 + 0xc))) {
    bVar10 = 0 < *(int *)(lVar11 + 0x10);
  }
  iVar2 = *(int *)(lVar11 + 0x14);
  fmt = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  CVar9 = fmt.order;
  bVar1 = (byte)fmt.order;
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar3 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar3 = (*pCVar7->_vptr_Context[0x75])(pCVar7,&shader);
  if ((CVar9 == A || bVar10) && ((RGBA < CVar9 || (0xedU >> (bVar1 & 0x1f) & 1) != 0) || 0 < iVar2))
  {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    for (iVar2 = 0; iVar2 < (this->super_TextureCubeSpecCase).m_numLevels; iVar2 = iVar2 + 1) {
      iVar8 = (this->super_TextureCubeSpecCase).m_size >> ((byte)iVar2 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      tcu::TextureLevel::setSize(&data,iVar8,iVar8,1);
      lVar11 = 0;
      while( true ) {
        if (lVar11 == 0x18) break;
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1c0,0.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&colorB,1.0);
        randomVector<4>((Functional *)&colorA,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_1c0,
                        (Vector<float,_4> *)&colorB);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1c0,0.0);
        tcu::Vector<float,_4>::Vector(&local_198,1.0);
        randomVector<4>((Functional *)&colorB,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_1c0,
                        &local_198);
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        tcu::TextureLevel::getAccess(&local_1c0,&data);
        tcu::fillWithGrid(&local_1c0,dVar4 % 0xf + 2,&colorA,&colorB);
        dVar4 = *(deUint32 *)((long)&s_cubeMapFaces + lVar11);
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_1c0,&data);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,dVar4,iVar2,format,iVar8,iVar8,0,format,type,
                   local_1c0.super_ConstPixelBufferAccess.m_data);
        lVar11 = lVar11 + 4;
      }
    }
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1c0,0.0);
    tcu::Vector<float,_4>::Vector(&colorA,1.0);
    FboTestUtil::GradientShader::setGradient(&shader,pCVar7,dVar3,(Vec4 *)&local_1c0,&colorA);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1c0.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_1c0.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_1c0.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data[2] = 0.0;
    sglr::drawQuad(pCVar7,dVar3,(Vec3 *)&local_1c0,(Vec3 *)&colorA);
    for (iVar2 = 0; iVar2 < (this->super_TextureCubeSpecCase).m_numLevels; iVar2 = iVar2 + 1) {
      iVar8 = (this->super_TextureCubeSpecCase).m_size >> ((byte)iVar2 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      for (lVar11 = 0; lVar11 != 0x18; lVar11 = lVar11 + 4) {
        width = de::Random::getInt(&rnd,1,iVar8);
        height = de::Random::getInt(&rnd,1,iVar8);
        xoffset = de::Random::getInt(&rnd,0,iVar8 - width);
        yoffset = de::Random::getInt(&rnd,0,iVar8 - height);
        iVar5 = sglr::ContextWrapper::getWidth(this_00);
        iVar5 = de::Random::getInt(&rnd,0,iVar5 - width);
        iVar6 = sglr::ContextWrapper::getHeight(this_00);
        iVar6 = de::Random::getInt(&rnd,0,iVar6 - height);
        sglr::ContextWrapper::glCopyTexSubImage2D
                  (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar11),iVar2,xoffset,yoffset,iVar5
                   ,iVar6,width,height);
      }
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x80f);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= glu::mapGLTransferFormat(m_format, m_dataType);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			data.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelSize, levelSize, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelSize);
				int		h			= rnd.getInt(1, levelSize);
				int		xo			= rnd.getInt(0, levelSize-w);
				int		yo			= rnd.getInt(0, levelSize-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}